

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *psVar3;
  ulong uVar4;
  ctrl_t *pcVar5;
  pointer pcVar6;
  size_type sVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined8 uVar24;
  ctrl_t *pcVar25;
  size_t sVar26;
  slot_type *psVar27;
  slot_type *psVar28;
  ulong uVar29;
  slot_type *psVar30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar31;
  ulong uVar32;
  byte bVar33;
  size_t i;
  FindInfo FVar34;
  type raw;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_51;
  ulong *local_50;
  undefined8 local_48;
  ulong local_40;
  undefined8 uStack_38;
  
  uVar4 = this->capacity_;
  if ((uVar4 == 0) || ((uVar4 + 1 & uVar4) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                 );
  }
  if (uVar4 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                 );
  }
  pcVar5 = this->ctrl_;
  if (pcVar5[uVar4] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar25 = pcVar5 + uVar4;
  if (pcVar25 + 1 != pcVar5) {
    uVar32 = 0;
    do {
      pcVar1 = pcVar5 + uVar32;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar5 + uVar32);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      uVar32 = uVar32 + 0x10;
    } while (uVar4 + 1 != uVar32);
  }
  uVar24 = *(undefined8 *)(pcVar5 + 8);
  *(undefined8 *)(pcVar25 + 1) = *(undefined8 *)pcVar5;
  *(undefined8 *)(pcVar25 + 9) = uVar24;
  *pcVar25 = -1;
  if (this->capacity_ == 0) {
    i = 0;
  }
  else {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        sVar26 = std::
                 hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator()(&local_51,this->slots_ + i);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = sVar26;
        uVar32 = SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),8) +
                 SUB168(auVar8 * ZEXT816(0xde5fb9d2630458e9),0);
        FVar34 = find_first_non_full(this,uVar32);
        sVar26 = FVar34.offset;
        uVar4 = this->capacity_;
        if ((uVar4 + 1 & uVar4) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar29 = uVar32 >> 7 & uVar4;
        bVar33 = (byte)uVar32;
        if (((i - uVar29 ^ sVar26 - uVar29) & uVar4) < 0x10) {
          bVar33 = bVar33 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar26] == -2) {
            set_ctrl(this,sVar26,bVar33 & 0x7f);
            psVar28 = this->slots_ + i;
            paVar31 = &psVar28->field_2;
            local_50 = (ulong *)(psVar28->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50 == paVar31) {
              local_40 = paVar31->_M_allocated_capacity;
              uStack_38 = *(undefined8 *)((long)&psVar28->field_2 + 8);
              local_50 = &local_40;
            }
            else {
              local_40 = paVar31->_M_allocated_capacity;
            }
            psVar28 = this->slots_ + i;
            sVar7 = psVar28->_M_string_length;
            (psVar28->_M_dataplus)._M_p = (pointer)paVar31;
            psVar28->_M_string_length = 0;
            (psVar28->field_2)._M_local_buf[0] = '\0';
            psVar27 = this->slots_;
            psVar28 = psVar27 + i;
            psVar30 = psVar27 + i;
            (psVar30->_M_dataplus)._M_p = (pointer)&psVar30->field_2;
            psVar3 = psVar27 + sVar26;
            paVar31 = &psVar3->field_2;
            pcVar6 = (psVar3->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar6 == paVar31) {
              uVar24 = *(undefined8 *)((long)&psVar3->field_2 + 8);
              (psVar30->field_2)._M_allocated_capacity = paVar31->_M_allocated_capacity;
              *(undefined8 *)((long)&psVar30->field_2 + 8) = uVar24;
            }
            else {
              (psVar28->_M_dataplus)._M_p = pcVar6;
              (psVar28->field_2)._M_allocated_capacity = paVar31->_M_allocated_capacity;
            }
            psVar27 = psVar27 + sVar26;
            psVar28->_M_string_length = psVar27->_M_string_length;
            (psVar27->_M_dataplus)._M_p = (pointer)paVar31;
            psVar27->_M_string_length = 0;
            (psVar27->field_2)._M_local_buf[0] = '\0';
            psVar28 = this->slots_ + sVar26;
            psVar30 = this->slots_ + sVar26;
            (psVar30->_M_dataplus)._M_p = (pointer)&psVar30->field_2;
            if (local_50 == &local_40) {
              (psVar30->field_2)._M_allocated_capacity = local_40;
              *(undefined8 *)((long)&psVar30->field_2 + 8) = uStack_38;
            }
            else {
              (psVar28->_M_dataplus)._M_p = (pointer)local_50;
              (psVar28->field_2)._M_allocated_capacity = local_40;
            }
            psVar28->_M_string_length = sVar7;
            local_48 = 0;
            local_40 = local_40 & 0xffffffffffffff00;
            i = i - 1;
            local_50 = &local_40;
            goto LAB_0013a6ae;
          }
          if (this->ctrl_[sVar26] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::basic_string<char>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<std::basic_string<char>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::basic_string<char>>]"
                         );
          }
          set_ctrl(this,sVar26,bVar33 & 0x7f);
          psVar27 = this->slots_;
          psVar28 = psVar27 + sVar26;
          psVar30 = psVar27 + sVar26;
          (psVar30->_M_dataplus)._M_p = (pointer)&psVar30->field_2;
          psVar3 = psVar27 + i;
          paVar31 = &psVar3->field_2;
          pcVar6 = (psVar3->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 == paVar31) {
            uVar24 = *(undefined8 *)((long)&psVar3->field_2 + 8);
            (psVar30->field_2)._M_allocated_capacity = paVar31->_M_allocated_capacity;
            *(undefined8 *)((long)&psVar30->field_2 + 8) = uVar24;
          }
          else {
            (psVar28->_M_dataplus)._M_p = pcVar6;
            (psVar28->field_2)._M_allocated_capacity = paVar31->_M_allocated_capacity;
          }
          psVar27 = psVar27 + i;
          psVar28->_M_string_length = psVar27->_M_string_length;
          (psVar27->_M_dataplus)._M_p = (pointer)paVar31;
          psVar27->_M_string_length = 0;
          (psVar27->field_2)._M_local_buf[0] = '\0';
          bVar33 = 0x80;
        }
        set_ctrl(this,i,bVar33);
      }
LAB_0013a6ae:
      i = i + 1;
    } while (i != this->capacity_);
  }
  reset_growth_left(this,i);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}